

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings.cpp
# Opt level: O3

void __thiscall E64::settings_t::update_current_path_from_settings(settings_t *this)

{
  FILE *__stream;
  size_t sVar1;
  char *__s;
  
  __stream = fopen("PATH","r");
  __s = this->current_path;
  if (__stream != (FILE *)0x0) {
    fgets(__s,0x100,__stream);
    if (*__s != '\0') {
      sVar1 = strlen(__s);
      if (__s[sVar1 - 1] == '\n') {
        this->current_path[sVar1 - 1] = '\0';
      }
    }
    printf("[Settings] current path is now: %s\n",__s);
    fclose(__stream);
    chdir(__s);
    return;
  }
  printf("[Settings] current path not found in settings, defaulting to: %s\n",__s);
  return;
}

Assistant:

void E64::settings_t::update_current_path_from_settings()
{
	FILE *temp_file = fopen("PATH", "r");
	if(temp_file) {
		fgets(current_path, 256, temp_file);
		size_t ln = strlen(current_path) - 1;
		if (*current_path && current_path[ln] == '\n')
			current_path[ln] = '\0';
		printf("[Settings] current path is now: %s\n", current_path);
		fclose(temp_file);
		chdir(current_path);
	} else {
		printf("[Settings] current path not found in settings, defaulting to: %s\n",
		       current_path);
	}
}